

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<QString,_long_long> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_long_long>_>::findNode<QString>
          (Data<QHashPrivate::Node<QString,_long_long>_> *this,QString *key)

{
  byte bVar1;
  size_t hash;
  Node<QString,_long_long> *pNVar2;
  QStringView key_00;
  Bucket BVar3;
  
  key_00.m_data = (key->d).ptr;
  key_00.m_size = (key->d).size;
  hash = ::qHash(key_00,this->seed);
  BVar3 = findBucketWithHash<QString>(this,key,hash);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<QString,_long_long> *)0x0;
  }
  else {
    pNVar2 = (Node<QString,_long_long> *)((BVar3.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }